

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O1

void __thiscall QStandardItem::setColumnCount(QStandardItem *this,int columns)

{
  int column;
  QStandardItemPrivate *this_00;
  int iVar1;
  long in_FS_OFFSET;
  QList<QStandardItem_*> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d;
  column = this_00->columns;
  if (column - columns != 0) {
    if (columns <= column) {
      iVar1 = 0;
      if (0 < columns) {
        iVar1 = columns;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        removeColumns(this,iVar1,column - columns);
        return;
      }
      goto LAB_0054fbb8;
    }
    iVar1 = 0;
    if (0 < column) {
      iVar1 = column;
    }
    local_28.d.d = (Data *)0x0;
    local_28.d.ptr = (QStandardItem **)0x0;
    local_28.d.size = 0;
    QStandardItemPrivate::insertColumns
              (this_00,column,(column >> 0x1f & iVar1 - column) + (columns - column),&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_0054fbb8:
  __stack_chk_fail();
}

Assistant:

void QStandardItem::setColumnCount(int columns)
{
    int cc = columnCount();
    if (cc == columns)
        return;
    if (cc < columns)
        insertColumns(qMax(cc, 0), columns - cc);
    else
        removeColumns(qMax(columns, 0), cc - columns);
}